

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O0

void __thiscall
BackgroundParseItem::BackgroundParseItem
          (BackgroundParseItem *this,JobManager *manager,Parser *parser,ParseNodeFnc *parseNode,
          bool defer)

{
  bool bVar1;
  bool defer_local;
  ParseNodeFnc *parseNode_local;
  Parser *parser_local;
  JobManager *manager_local;
  BackgroundParseItem *this_local;
  
  JsUtil::Job::Job(&this->super_Job,manager,false);
  this->parser = (Parser *)0x0;
  this->nextItem = (BackgroundParseItem *)0x0;
  this->nextUnprocessedItem = (BackgroundParseItem *)0x0;
  this->prevUnprocessedItem = (BackgroundParseItem *)0x0;
  this->parseNode = parseNode;
  this->pse = (CompileScriptException *)0x0;
  this->regExpNodes = (NodeDList *)0x0;
  this->maxBlockId = 0xffffffff;
  this->isDeferred = defer;
  bVar1 = Parser::IsStrictMode(parser);
  this->strictMode = bVar1;
  this->inParseQueue = false;
  this->completed = false;
  Parser::CaptureContext(parser,&this->parseContext);
  return;
}

Assistant:

BackgroundParseItem::BackgroundParseItem(JsUtil::JobManager *const manager, Parser *const parser, ParseNodeFnc *parseNode, bool defer)
    : JsUtil::Job(manager),
      maxBlockId((uint)-1),
      strictMode(parser->IsStrictMode()),
      parseNode(parseNode),
      parser(nullptr),
      nextItem(nullptr),
      nextUnprocessedItem(nullptr),
      prevUnprocessedItem(nullptr),
      pse(nullptr),
      regExpNodes(nullptr),
      completed(false),
      inParseQueue(false),
      isDeferred(defer)
{
    parser->CaptureContext(&parseContext);
}